

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-metadce.cpp
# Opt level: O0

void __thiscall
MetaDCEGraph::scanWebAssembly()::InitScanner::visitRefFunc(wasm::RefFunc__(void *this,RefFunc *curr)

{
  bool bVar1;
  mapped_type *pmVar2;
  IString local_28;
  RefFunc *local_18;
  RefFunc *curr_local;
  InitScanner *this_local;
  
  local_18 = curr;
  curr_local = (RefFunc *)this;
  bVar1 = wasm::IString::isNull((IString *)((long)this + 0xe0));
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!parentDceName.isNull()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-metadce.cpp"
                  ,0x95,"void MetaDCEGraph::scanWebAssembly()::InitScanner::visitRefFunc(RefFunc *)"
                 );
  }
  pmVar2 = std::
           unordered_map<wasm::Name,_DCENode,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_DCENode>_>_>
           ::operator[](*(unordered_map<wasm::Name,_DCENode,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_DCENode>_>_>
                          **)((long)this + 0xd8),(key_type *)((long)this + 0xe0));
  local_28.str = (string_view)
                 getDCEName(*(MetaDCEGraph **)((long)this + 0xd8),Function,
                            *(string_view *)(local_18 + 0x10));
  std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
            (&pmVar2->reaches,(value_type *)&local_28);
  return;
}

Assistant:

void visitRefFunc(RefFunc* curr) {
        assert(!parentDceName.isNull());
        parent->nodes[parentDceName].reaches.push_back(
          parent->getDCEName(ModuleItemKind::Function, curr->func));
      }